

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillAuxSlotPtrSyms
          (GlobOpt *this,PropertySymOpnd *opnd,BasicBlock *block,bool isObjTypeSpecialized)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *local_30;
  StackSym *auxSlotPtrSym;
  bool isObjTypeSpecialized_local;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  GlobOpt *this_local;
  
  local_30 = (StackSym *)0x0;
  if ((isObjTypeSpecialized) &&
     (local_30 = IR::PropertySymOpnd::GetAuxSlotPtrSym(opnd), local_30 != (StackSym *)0x0)) {
    if ((this->auxSlotPtrSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
       (BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->auxSlotPtrSyms,(local_30->super_Sym).m_id), BVar2 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x3c9,
                         "(this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id))"
                         ,"this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id)")
      ;
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear(this->auxSlotPtrSyms,(local_30->super_Sym).m_id);
  }
  BVSparse<Memory::JitArenaAllocator>::Minus((block->globOptData).liveFields,this->auxSlotPtrSyms);
  if (local_30 != (StackSym *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Set(this->auxSlotPtrSyms,(local_30->super_Sym).m_id);
  }
  return;
}

Assistant:

void
GlobOpt::KillAuxSlotPtrSyms(IR::PropertySymOpnd *opnd, BasicBlock *block, bool isObjTypeSpecialized)
{
    StackSym *auxSlotPtrSym = nullptr;
    if (isObjTypeSpecialized)
    {
        // Kill all aux slot syms other than this one
        auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
        if (auxSlotPtrSym)
        {
            Assert(this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id));
            this->auxSlotPtrSyms->Clear(auxSlotPtrSym->m_id);
        }
    }

    block->globOptData.liveFields->Minus(this->auxSlotPtrSyms);

    if (auxSlotPtrSym)
    {
        this->auxSlotPtrSyms->Set(auxSlotPtrSym->m_id);
    }
}